

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

PatternList *
parse_expr(PatternList *__return_storage_ptr__,Tokens *tokens,
          vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  bool bVar1;
  string *psVar2;
  shared_ptr<docopt::Pattern> *local_130;
  allocator<std::shared_ptr<docopt::Pattern>_> local_e1;
  PatternList *local_e0;
  undefined1 local_d8 [24];
  size_type local_c0;
  undefined1 local_b8 [40];
  string local_90;
  undefined1 local_70 [16];
  undefined1 local_60 [8];
  PatternList ret;
  undefined1 local_38 [8];
  PatternList seq;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *options_local;
  Tokens *tokens_local;
  
  seq.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)options;
  parse_seq((PatternList *)local_38,tokens,options);
  psVar2 = Tokens::current_abi_cxx11_(tokens);
  bVar1 = std::operator!=(psVar2,"|");
  if (bVar1) {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(__return_storage_ptr__,
           (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)local_38);
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)local_60);
    maybe_collapse_to_required((PatternList *)local_70);
    std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
    emplace_back<std::shared_ptr<docopt::Pattern>>
              ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                *)local_60,(shared_ptr<docopt::Pattern> *)local_70);
    std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)local_70);
    while( true ) {
      psVar2 = Tokens::current_abi_cxx11_(tokens);
      bVar1 = std::operator==(psVar2,"|");
      if (!bVar1) break;
      Tokens::pop_abi_cxx11_(&local_90,tokens);
      std::__cxx11::string::~string((string *)&local_90);
      parse_seq((PatternList *)(local_b8 + 0x10),tokens,
                (vector<docopt::Option,_std::allocator<docopt::Option>_> *)
                seq.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      operator=((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 *)local_38,
                (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 *)(local_b8 + 0x10));
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)(local_b8 + 0x10));
      maybe_collapse_to_required((PatternList *)local_b8);
      std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
      ::emplace_back<std::shared_ptr<docopt::Pattern>>
                ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                  *)local_60,(shared_ptr<docopt::Pattern> *)local_b8);
      std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)local_b8);
    }
    local_e0 = (PatternList *)local_d8;
    maybe_collapse_to_either(local_e0);
    local_d8._16_8_ = local_d8;
    local_c0 = 1;
    std::allocator<std::shared_ptr<docopt::Pattern>_>::allocator(&local_e1);
    __l._M_len = local_c0;
    __l._M_array = (iterator)local_d8._16_8_;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(__return_storage_ptr__,__l,&local_e1);
    std::allocator<std::shared_ptr<docopt::Pattern>_>::~allocator(&local_e1);
    local_130 = (shared_ptr<docopt::Pattern> *)(local_d8 + 0x10);
    do {
      local_130 = local_130 + -1;
      std::shared_ptr<docopt::Pattern>::~shared_ptr(local_130);
    } while (local_130 != (shared_ptr<docopt::Pattern> *)local_d8);
    ret.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_60);
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_38);
  return __return_storage_ptr__;
}

Assistant:

PatternList parse_expr(Tokens& tokens, std::vector<Option>& options)
{
	// expr ::= seq ( '|' seq )* ;

	auto seq = parse_seq(tokens, options);

	if (tokens.current() != "|")
		return seq;

	PatternList ret;
	ret.emplace_back(maybe_collapse_to_required(std::move(seq)));

	while (tokens.current() == "|") {
		tokens.pop();
		seq = parse_seq(tokens, options);
		ret.emplace_back(maybe_collapse_to_required(std::move(seq)));
	}

	return { maybe_collapse_to_either(std::move(ret)) };
}